

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_jp2_t * jp2_create_compress(opj_common_ptr cinfo)

{
  opj_j2k_t *poVar1;
  opj_common_ptr in_RDI;
  opj_jp2_t *jp2;
  opj_jp2_t *local_8;
  
  local_8 = (opj_jp2_t *)malloc(0x68);
  if (local_8 != (opj_jp2_t *)0x0) {
    local_8->cinfo = in_RDI;
    poVar1 = j2k_create_compress(in_RDI);
    local_8->j2k = poVar1;
    if (local_8->j2k == (opj_j2k_t *)0x0) {
      jp2_destroy_compress((opj_jp2_t *)0x2bd033);
      local_8 = (opj_jp2_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

opj_jp2_t* jp2_create_compress(opj_common_ptr cinfo) {
	opj_jp2_t *jp2 = (opj_jp2_t*)opj_malloc(sizeof(opj_jp2_t));
	if(jp2) {
		jp2->cinfo = cinfo;
		/* create the J2K codec */
		jp2->j2k = j2k_create_compress(cinfo);
		if(jp2->j2k == NULL) {
			jp2_destroy_compress(jp2);
			return NULL;
		}
	}
	return jp2;
}